

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader_database.cpp
# Opt level: O0

void test_shader_code_compilation(GLuint p_shader,ShaderType p_type)

{
  ostream *poVar1;
  GLchar local_418 [8];
  GLchar info_log [1024];
  GLint success;
  ShaderType p_type_local;
  GLuint p_shader_local;
  
  (*glad_glGetShaderiv)(p_shader,0x8b81,(GLint *)(info_log + 0x3fc));
  if (info_log._1020_4_ == 0) {
    (*glad_glGetShaderInfoLog)(p_shader,0x400,(GLsizei *)0x0,local_418);
    poVar1 = std::operator<<((ostream *)&std::cerr,"p_shader:");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,p_shader);
    poVar1 = std::operator<<(poVar1," shader code compilation failed p_type:");
    poVar1 = operator<<(poVar1,p_type);
    std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<((ostream *)&std::cerr,"error:");
    poVar1 = std::operator<<(poVar1,local_418);
    std::operator<<(poVar1,"\n");
  }
  return;
}

Assistant:

void test_shader_code_compilation(
    const GLuint p_shader,
    const ShaderType p_type) noexcept
{
    static constexpr auto info_log_size = 1024;
    GLint success;
    GLchar info_log[info_log_size];
    glGetShaderiv(p_shader, GL_COMPILE_STATUS, &success);
    if (!success)
    {
        glGetShaderInfoLog(p_shader, info_log_size, nullptr, info_log);
        std::cerr << "p_shader:" << p_shader << " shader code compilation failed p_type:" << p_type << "\n";
        std::cerr << "error:" << info_log << "\n";
    }
}